

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzhamtest.cpp
# Opt level: O0

FILE * open_file_with_retries(char *pFilename,char *pMode)

{
  FILE *pFVar1;
  char *in_RSI;
  char *in_RDI;
  FILE *pFile;
  uint i;
  uint cNumRetries;
  uint local_20;
  
  local_20 = 0;
  while( true ) {
    if (7 < local_20) {
      return (FILE *)0x0;
    }
    pFVar1 = fopen64(in_RDI,in_RSI);
    if (pFVar1 != (FILE *)0x0) break;
    usleep(250000);
    local_20 = local_20 + 1;
  }
  return (FILE *)pFVar1;
}

Assistant:

static FILE* open_file_with_retries(const char *pFilename, const char* pMode)
{
   const uint cNumRetries = 8;
   for (uint i = 0; i < cNumRetries; i++)
   {
      FILE* pFile = fopen(pFilename, pMode);
      if (pFile)
         return pFile;
      Sleep(250);
   }
   return NULL;
}